

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg.h
# Opt level: O0

void __thiscall spdlog::details::log_msg::log_msg(log_msg *this,string *loggers_name,level_enum lvl)

{
  time_point tVar1;
  size_t sVar2;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  level_enum local_1c;
  string *psStack_18;
  level_enum lvl_local;
  string *loggers_name_local;
  log_msg *this_local;
  
  this->logger_name = loggers_name;
  this->level = lvl;
  local_1c = lvl;
  psStack_18 = loggers_name;
  loggers_name_local = (string *)this;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->time);
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(&this->raw,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(&this->formatted,local_2d);
  std::allocator<char>::~allocator(local_2d);
  this->msg_id = 0;
  this->color_range_start = 0;
  this->color_range_end = 0;
  tVar1 = os::now();
  (this->time).__d.__r = (rep)tVar1.__d.__r;
  sVar2 = os::thread_id();
  this->thread_id = sVar2;
  return;
}

Assistant:

log_msg(const std::string *loggers_name, level::level_enum lvl)
        : logger_name(loggers_name)
        , level(lvl)
    {
#ifndef SPDLOG_NO_DATETIME
        time = os::now();
#endif

#ifndef SPDLOG_NO_THREAD_ID
        thread_id = os::thread_id();
#endif
    }